

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int s2pred::TriageCompareEdgeDirections<long_double>
              (Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
              Vector3<long_double> *b1)

{
  int iVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  
  lVar2 = *(longdouble *)a0->c_ - *(longdouble *)a1->c_;
  lVar3 = *(longdouble *)(a0->c_ + 1) - *(longdouble *)(a1->c_ + 1);
  lVar8 = *(longdouble *)a0->c_ + *(longdouble *)a1->c_;
  lVar5 = *(longdouble *)(a0->c_ + 1) + *(longdouble *)(a1->c_ + 1);
  lVar4 = *(longdouble *)(a0->c_ + 2) - *(longdouble *)(a1->c_ + 2);
  lVar10 = *(longdouble *)(a0->c_ + 2) + *(longdouble *)(a1->c_ + 2);
  lVar6 = lVar3 * lVar10 - lVar5 * lVar4;
  lVar11 = lVar4 * lVar8 - lVar10 * lVar2;
  lVar5 = lVar2 * lVar5 - lVar8 * lVar3;
  lVar2 = *(longdouble *)b0->c_ - *(longdouble *)b1->c_;
  lVar9 = *(longdouble *)b1->c_ + *(longdouble *)b0->c_;
  lVar3 = *(longdouble *)(b0->c_ + 1) - *(longdouble *)(b1->c_ + 1);
  lVar8 = *(longdouble *)(b0->c_ + 1) + *(longdouble *)(b1->c_ + 1);
  lVar4 = *(longdouble *)(b0->c_ + 2) - *(longdouble *)(b1->c_ + 2);
  lVar10 = *(longdouble *)(b0->c_ + 2) + *(longdouble *)(b1->c_ + 2);
  lVar7 = lVar3 * lVar10 - lVar8 * lVar4;
  lVar10 = lVar4 * lVar9 - lVar10 * lVar2;
  lVar4 = lVar2 * lVar8 - lVar9 * lVar3;
  lVar2 = SQRT(lVar5 * lVar5 + lVar11 * lVar11 + lVar6 * lVar6);
  lVar3 = SQRT(lVar10 * lVar10 + lVar7 * lVar7 + lVar4 * lVar4);
  lVar4 = lVar5 * lVar4 + (longdouble)0 + lVar6 * lVar7 + lVar10 * lVar11;
  lVar2 = ((lVar2 + lVar3) * (longdouble)6.153480596427404e-15 +
          lVar2 * (longdouble)11.928203230275509 * lVar3) * (longdouble)5.421011e-20;
  iVar1 = 1;
  if (lVar4 <= lVar2) {
    iVar1 = -(uint)(lVar4 < -lVar2);
  }
  return iVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }